

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::FieldDescriptorProto::ByteSize(FieldDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FieldOptions *this_00;
  
  bVar1 = (byte)this->_has_bits_[0];
  iVar4 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      psVar2 = this->name_;
      uVar6 = (uint)psVar2->_M_string_length;
      iVar4 = 2;
      if (0x7f < uVar6) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
        iVar4 = iVar4 + 1;
      }
      iVar4 = iVar4 + (int)psVar2->_M_string_length;
    }
    if ((this->_has_bits_[0] & 2) != 0) {
      uVar6 = this->number_;
      if ((int)uVar6 < 0) {
        iVar5 = 0xb;
      }
      else {
        iVar5 = 2;
        if (0x7f < uVar6) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar5 = iVar5 + 1;
        }
      }
      iVar4 = iVar4 + iVar5;
    }
    if ((this->_has_bits_[0] & 4) != 0) {
      uVar6 = this->label_;
      if ((int)uVar6 < 0) {
        iVar5 = 0xb;
      }
      else {
        iVar5 = 2;
        if (0x7f < uVar6) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar5 = iVar5 + 1;
        }
      }
      iVar4 = iVar4 + iVar5;
    }
    if ((this->_has_bits_[0] & 8) != 0) {
      uVar6 = this->type_;
      if ((int)uVar6 < 0) {
        iVar5 = 0xb;
      }
      else {
        iVar5 = 2;
        if (0x7f < uVar6) {
          iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar5 = iVar5 + 1;
        }
      }
      iVar4 = iVar4 + iVar5;
    }
    if ((this->_has_bits_[0] & 0x10) != 0) {
      psVar2 = this->type_name_;
      uVar6 = (uint)psVar2->_M_string_length;
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + iVar5 + (int)psVar2->_M_string_length + 1;
    }
    if ((this->_has_bits_[0] & 0x20) != 0) {
      psVar2 = this->extendee_;
      uVar6 = (uint)psVar2->_M_string_length;
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + iVar5 + (int)psVar2->_M_string_length + 1;
    }
    if ((this->_has_bits_[0] & 0x40) != 0) {
      psVar2 = this->default_value_;
      uVar6 = (uint)psVar2->_M_string_length;
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + iVar5 + (int)psVar2->_M_string_length + 1;
    }
    if ((this->_has_bits_[0] & 0x80) != 0) {
      this_00 = this->options_;
      if (this_00 == (FieldOptions *)0x0) {
        this_00 = *(FieldOptions **)(default_instance_ + 0x38);
      }
      uVar6 = FieldOptions::ByteSize(this_00);
      iVar5 = 1;
      if (0x7f < uVar6) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar5 + 1;
    }
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar5 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar5 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int FieldDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional int32 number = 3;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
    }

    // optional string type_name = 6;
    if (has_type_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type_name());
    }

    // optional string extendee = 2;
    if (has_extendee()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->extendee());
    }

    // optional string default_value = 7;
    if (has_default_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->default_value());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}